

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O3

bool chrono::utils::Validate
               (Data *sim_data,Data *ref_data,ChNormType norm_type,double tolerance,
               DataVector *norms)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  double *__s;
  long lVar4;
  double *__src;
  bool bVar5;
  ChValidation validator;
  ChValidation local_c8;
  
  local_c8.m_INF_norms._M_size = 0;
  local_c8.m_INF_norms._M_data = (double *)0x0;
  local_c8.m_sim_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.m_ref_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.m_ref_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.m_ref_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.m_L2_norms._M_size = 0;
  local_c8.m_L2_norms._M_data = (double *)0x0;
  local_c8.m_RMS_norms._M_size = 0;
  local_c8.m_RMS_norms._M_data = (double *)0x0;
  local_c8.m_sim_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.m_sim_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.m_sim_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.m_ref_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.m_ref_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.m_ref_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.m_sim_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.m_sim_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar3 = ChValidation::Process(&local_c8,sim_data,ref_data);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_0092432c;
  }
  __s = norms->_M_data;
  sVar1 = local_c8.m_num_cols - 1;
  if (norms->_M_size != sVar1) {
    operator_delete(__s);
    norms->_M_size = sVar1;
    __s = (double *)::operator_new(sVar1 * 8);
    norms->_M_data = __s;
  }
  if (sVar1 != 0) {
    memset(__s,0,local_c8.m_num_cols * 8 - 8);
  }
  if (norm_type == L2_NORM) {
    sVar2 = norms->_M_size;
    if (sVar2 == local_c8.m_L2_norms._M_size) {
      __src = local_c8.m_L2_norms._M_data;
      if (sVar2 == 0) goto LAB_009242ff;
    }
    else {
      if (__s != (double *)0x0) {
        operator_delete(__s);
      }
      norms->_M_size = local_c8.m_L2_norms._M_size;
      __s = (double *)::operator_new(local_c8.m_L2_norms._M_size << 3);
      norms->_M_data = __s;
      __src = local_c8.m_L2_norms._M_data;
LAB_009242df:
      if (__src == (double *)0x0) goto LAB_009242ff;
      sVar2 = norms->_M_size;
    }
LAB_009242f4:
    memcpy(__s,__src,sVar2 << 3);
  }
  else {
    if (norm_type == RMS_NORM) {
      sVar2 = norms->_M_size;
      __src = local_c8.m_RMS_norms._M_data;
      if (sVar2 != local_c8.m_RMS_norms._M_size) {
        if (__s != (double *)0x0) {
          operator_delete(__s);
        }
        norms->_M_size = local_c8.m_RMS_norms._M_size;
        __s = (double *)::operator_new(local_c8.m_RMS_norms._M_size << 3);
        norms->_M_data = __s;
        __src = local_c8.m_RMS_norms._M_data;
        goto LAB_009242df;
      }
    }
    else {
      if (norm_type != INF_NORM) goto LAB_009242ff;
      sVar2 = norms->_M_size;
      __src = local_c8.m_INF_norms._M_data;
      if (sVar2 != local_c8.m_INF_norms._M_size) {
        if (__s != (double *)0x0) {
          operator_delete(__s);
        }
        norms->_M_size = local_c8.m_INF_norms._M_size;
        __s = (double *)::operator_new(local_c8.m_INF_norms._M_size << 3);
        norms->_M_data = __s;
        __src = local_c8.m_INF_norms._M_data;
        goto LAB_009242df;
      }
    }
    if (sVar2 != 0) goto LAB_009242f4;
  }
LAB_009242ff:
  if (sVar1 == 0) {
    bVar3 = true;
  }
  else {
    lVar4 = 0;
    do {
      bVar3 = norms->_M_data[lVar4] <= tolerance;
      if (tolerance < norms->_M_data[lVar4]) break;
      bVar5 = local_c8.m_num_cols - 2 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar5);
  }
LAB_0092432c:
  ChValidation::~ChValidation(&local_c8);
  return bVar3;
}

Assistant:

ChApi bool Validate(const Data& sim_data,
                    const Data& ref_data,
                    ChNormType norm_type,
                    double tolerance,
                    DataVector& norms) {
    ChValidation validator;

    if (!validator.Process(sim_data, ref_data))
        return false;

    size_t num_cols = validator.GetNumColumns() - 1;
    norms.resize(num_cols);

    switch (norm_type) {
        case L2_NORM:
            norms = validator.GetL2norms();
            break;
        case RMS_NORM:
            norms = validator.GetRMSnorms();
            break;
        case INF_NORM:
            norms = validator.GetINFnorms();
            break;
    }

    for (size_t col = 0; col < num_cols; col++) {
        if (norms[col] > tolerance)
            return false;
    }

    return true;
}